

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O2

void InstructionSet::M68k::Primitive::
     shift<(InstructionSet::M68k::Operation)82,unsigned_short,CPU::MC68000::ProcessorBase>
               (uint32_t source,unsigned_short *destination,Status *status,
               ProcessorBase *flow_controller)

{
  uint uVar1;
  uint uVar2;
  FlagT FVar3;
  
  uVar2 = source & 0x3f;
  flow_controller->dynamic_instruction_length_ = uVar2 + 1;
  if (uVar2 == 0) {
    status->overflow_flag = 0;
    status->carry_flag = 0;
    uVar1 = (uint)*destination;
  }
  else {
    FVar3 = (FlagT)((*destination >> (uVar2 - 1 & 0x1f) & 1) != 0);
    if (0x10 < uVar2) {
      FVar3 = 0;
    }
    status->extend_flag = FVar3;
    status->carry_flag = FVar3;
    status->overflow_flag = 0;
    uVar1 = (uint)(*destination >> ((byte)uVar2 & 0x1f));
    if (0xf < uVar2) {
      uVar1 = 0;
    }
    *destination = (unsigned_short)uVar1;
  }
  status->zero_result = (ulong)(ushort)uVar1;
  status->negative_flag = (ulong)(uVar1 & 0x8000);
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}